

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void t1_make_subfont(FT_Face face,PS_Private priv,CFF_SubFont subfont)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  undefined1 uVar6;
  byte bVar7;
  FT_Face_Internal pFVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 local_34 [4];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined3 uVar3;
  undefined2 uVar5;
  
  memset(subfont,0,0x4c8);
  bVar7 = priv->num_blue_values;
  (subfont->private_dict).num_blue_values = bVar7;
  for (uVar15 = 0; bVar7 != uVar15; uVar15 = uVar15 + 1) {
    (subfont->private_dict).blue_values[uVar15] = (long)priv->blue_values[uVar15];
  }
  bVar7 = priv->num_other_blues;
  (subfont->private_dict).num_other_blues = bVar7;
  for (uVar15 = 0; bVar7 != uVar15; uVar15 = uVar15 + 1) {
    (subfont->private_dict).other_blues[uVar15] = (long)priv->other_blues[uVar15];
  }
  bVar7 = priv->num_family_blues;
  (subfont->private_dict).num_family_blues = bVar7;
  for (uVar15 = 0; bVar7 != uVar15; uVar15 = uVar15 + 1) {
    (subfont->private_dict).family_blues[uVar15] = (long)priv->family_blues[uVar15];
  }
  bVar7 = priv->num_family_other_blues;
  (subfont->private_dict).num_family_other_blues = bVar7;
  for (uVar15 = 0; bVar7 != uVar15; uVar15 = uVar15 + 1) {
    (subfont->private_dict).family_other_blues[uVar15] = (long)priv->family_other_blues[uVar15];
  }
  (subfont->private_dict).blue_scale = priv->blue_scale;
  (subfont->private_dict).blue_shift = (long)priv->blue_shift;
  (subfont->private_dict).blue_fuzz = (long)priv->blue_fuzz;
  uVar15._0_2_ = priv->standard_width[0];
  uVar15._2_2_ = priv->standard_height[0];
  uVar1 = priv->num_snap_widths;
  uVar2 = priv->num_snap_heights;
  uVar4 = priv->force_bold;
  uVar6 = priv->round_stem_up;
  uVar5 = CONCAT11(uVar6,uVar4);
  uVar3 = CONCAT21(uVar5,uVar2);
  uVar15._4_4_ = CONCAT31(uVar3,uVar1);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar15;
  auVar9._12_2_ = uVar5;
  auVar10._8_2_ = (short)uVar15._4_4_;
  auVar10._0_8_ = uVar15;
  auVar10._10_4_ = auVar9._10_4_;
  auVar11._6_8_ = 0;
  auVar11._0_6_ = auVar10._8_6_;
  auVar16._0_8_ = uVar15 & 0xffff;
  auVar16._8_4_ = (int)CONCAT82(SUB148(auVar11 << 0x40,6),uVar15._2_2_);
  auVar16._12_4_ = 0;
  (subfont->private_dict).standard_width = auVar16._0_8_;
  (subfont->private_dict).standard_height = auVar16._8_8_;
  bVar7 = priv->num_snap_widths;
  (subfont->private_dict).num_snap_widths = bVar7;
  for (uVar15 = 0; bVar7 != uVar15; uVar15 = uVar15 + 1) {
    (subfont->private_dict).snap_widths[uVar15] = (long)priv->snap_widths[uVar15];
  }
  bVar7 = priv->num_snap_heights;
  (subfont->private_dict).num_snap_heights = bVar7;
  for (uVar15 = 0; bVar7 != uVar15; uVar15 = uVar15 + 1) {
    (subfont->private_dict).snap_heights[uVar15] = (long)priv->snap_heights[uVar15];
  }
  (subfont->private_dict).force_bold = priv->force_bold;
  (subfont->private_dict).lenIV = priv->lenIV;
  (subfont->private_dict).language_group = (FT_Int)priv->language_group;
  (subfont->private_dict).expansion_factor = priv->expansion_factor;
  (subfont->private_dict).subfont = subfont;
  pFVar8 = face->internal;
  uVar13 = pFVar8->random_seed;
  if ((uVar13 == 0xffffffff) || (subfont->random = uVar13, uVar13 == 0)) {
    uVar12 = (uint)local_34 ^ (uint)local_30 ^ (uint)local_28;
    uVar14 = uVar12 >> 0x14 ^ uVar12 >> 10;
    uVar13 = 0x7384;
    if (uVar14 != uVar12) {
      uVar13 = uVar14 ^ uVar12;
    }
    subfont->random = uVar13;
  }
  else {
    do {
      uVar13 = uVar13 << 0xd ^ uVar13;
      uVar13 = uVar13 >> 0x11 ^ uVar13;
      uVar13 = uVar13 << 5 ^ uVar13;
    } while ((int)uVar13 < 0);
    pFVar8->random_seed = uVar13;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_make_subfont( FT_Face      face,
                   PS_Private   priv,
                   CFF_SubFont  subfont )
  {
    CFF_Private  cpriv = &subfont->private_dict;
    FT_UInt      n, count;


    FT_ZERO( subfont );
    FT_ZERO( cpriv );

    count = cpriv->num_blue_values = priv->num_blue_values;
    for ( n = 0; n < count; n++ )
      cpriv->blue_values[n] = (FT_Pos)priv->blue_values[n];

    count = cpriv->num_other_blues = priv->num_other_blues;
    for ( n = 0; n < count; n++ )
      cpriv->other_blues[n] = (FT_Pos)priv->other_blues[n];

    count = cpriv->num_family_blues = priv->num_family_blues;
    for ( n = 0; n < count; n++ )
      cpriv->family_blues[n] = (FT_Pos)priv->family_blues[n];

    count = cpriv->num_family_other_blues = priv->num_family_other_blues;
    for ( n = 0; n < count; n++ )
      cpriv->family_other_blues[n] = (FT_Pos)priv->family_other_blues[n];

    cpriv->blue_scale = priv->blue_scale;
    cpriv->blue_shift = (FT_Pos)priv->blue_shift;
    cpriv->blue_fuzz  = (FT_Pos)priv->blue_fuzz;

    cpriv->standard_width  = (FT_Pos)priv->standard_width[0];
    cpriv->standard_height = (FT_Pos)priv->standard_height[0];

    count = cpriv->num_snap_widths = priv->num_snap_widths;
    for ( n = 0; n < count; n++ )
      cpriv->snap_widths[n] = (FT_Pos)priv->snap_widths[n];

    count = cpriv->num_snap_heights = priv->num_snap_heights;
    for ( n = 0; n < count; n++ )
      cpriv->snap_heights[n] = (FT_Pos)priv->snap_heights[n];

    cpriv->force_bold       = priv->force_bold;
    cpriv->lenIV            = priv->lenIV;
    cpriv->language_group   = priv->language_group;
    cpriv->expansion_factor = priv->expansion_factor;

    cpriv->subfont = subfont;


    /* Initialize the random number generator. */
    if ( face->internal->random_seed != -1 )
    {
      /* If we have a face-specific seed, use it.    */
      /* If non-zero, update it to a positive value. */
      subfont->random = (FT_UInt32)face->internal->random_seed;
      if ( face->internal->random_seed )
      {
        do
        {
          face->internal->random_seed = (FT_Int32)cff_random(
            (FT_UInt32)face->internal->random_seed );

        } while ( face->internal->random_seed < 0 );
      }
    }
    if ( !subfont->random )
    {
      FT_UInt32  seed;


      /* compute random seed from some memory addresses */
      seed = (FT_UInt32)( (FT_Offset)(char*)&seed    ^
                          (FT_Offset)(char*)&face    ^
                          (FT_Offset)(char*)&subfont );
      seed = seed ^ ( seed >> 10 ) ^ ( seed >> 20 );
      if ( seed == 0 )
        seed = 0x7384;

      subfont->random = seed;
    }
  }